

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  int val;
  int *bitCntP;
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  float *d7p;
  uint uVar10;
  bool bVar11;
  unsigned_short bits [2];
  unsigned_short local_160 [2];
  unsigned_short local_15c [2];
  int *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  int DU [64];
  
  local_15c = *HTAC;
  local_160 = HTAC[0xf0];
  lVar4 = (long)du_stride;
  d7p = CDU + 7;
  local_150 = fdtbl;
  for (lVar7 = 0; lVar7 < (long)(ulong)(uint)(du_stride << 3); lVar7 = lVar7 + lVar4) {
    stbiw__jpg_DCT(d7p + -7,d7p + -6,d7p + -5,d7p + -4,d7p + -3,d7p + -2,d7p + -1,d7p);
    d7p = d7p + lVar4;
  }
  local_140 = CDU + du_stride * 3;
  local_148 = CDU + (uint)(du_stride * 4);
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
    stbiw__jpg_DCT((float *)((long)CDU + lVar7),(float *)((long)CDU + lVar7 + lVar4 * 4),
                   (float *)((long)CDU + lVar7 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)local_140 + lVar7),(float *)((long)local_148 + lVar7),
                   (float *)((long)CDU + lVar7 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar7 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar7 + (long)(du_stride * 7) * 4));
  }
  lVar5 = 0;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    lVar5 = (long)(int)lVar5;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      DU[""[lVar5 + lVar6]] =
           (int)(CDU[lVar6] * local_150[lVar5 + lVar6] +
                *(float *)(&DAT_001191d0 + (ulong)(CDU[lVar6] * local_150[lVar5 + lVar6] < 0.0) * 4)
                );
    }
    CDU = CDU + lVar4;
    lVar5 = lVar5 + 8;
  }
  if (DU[0] - DC != 0) {
    stbiw__jpg_calcBits(DU[0] - DC,bits);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[bits[1]]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  iVar2 = 0;
  uVar8 = 0x3f;
  while( true ) {
    if ((int)uVar8 == 0) goto LAB_0011502d;
    if (DU[uVar8 & 0xffffffff] != 0) break;
    iVar2 = iVar2 + 1;
    uVar8 = uVar8 - 1;
  }
  local_158 = bitCnt;
  for (iVar1 = 1; bitCntP = local_158, iVar1 <= (int)uVar8; iVar1 = iVar1 + uVar3 + 1) {
    lVar4 = (long)iVar1;
    uVar3 = 0xffffffff;
    uVar10 = 0;
    do {
      uVar9 = uVar10;
      val = DU[lVar4];
      uVar3 = uVar3 + 1;
      if ((long)uVar8 < lVar4) break;
      lVar4 = lVar4 + 1;
      uVar10 = uVar9 + 1;
    } while (val == 0);
    uVar10 = uVar3;
    if (0xf < (int)uVar3) {
      uVar9 = uVar9 >> 4;
      while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
        stbiw__jpg_writeBits(s,bitBuf,bitCntP,local_160);
      }
      uVar10 = uVar3 & 0xf;
    }
    stbiw__jpg_calcBits(val,bits);
    bitCnt = local_158;
    stbiw__jpg_writeBits(s,bitBuf,local_158,HTAC[(long)(int)(uVar10 << 4) + (ulong)bits[1]]);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
  }
  if (iVar2 != 0) {
LAB_0011502d:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,local_15c);
  }
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}